

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PackedFieldHelper<18>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  RepeatedField<long> *this;
  uint32_t *puVar3;
  long *ptr;
  int local_30;
  int i;
  int cached_size;
  RepeatedField<long> *array;
  CodedOutputStream *output_local;
  FieldMetadata *md_local;
  void *field_local;
  
  this = Get<google::protobuf::RepeatedField<long>>(field);
  bVar1 = RepeatedField<long>::empty(this);
  if (!bVar1) {
    WriteTagTo<google::protobuf::io::CodedOutputStream>(md->tag,output);
    puVar3 = (uint32_t *)Get<int>((void *)((long)field + 0x10));
    WriteLengthTo<google::protobuf::io::CodedOutputStream>(*puVar3,output);
    for (local_30 = 0; iVar2 = RepeatedField<long>::size(this), local_30 < iVar2;
        local_30 = local_30 + 1) {
      ptr = RepeatedField<long>::operator[](this,local_30);
      SerializeTo<18,google::protobuf::io::CodedOutputStream>(ptr,output);
    }
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    if (array.empty()) return;
    WriteTagTo(md.tag, output);
    int cached_size =
        Get<int>(static_cast<const uint8_t*>(field) + sizeof(RepeatedField<T>));
    WriteLengthTo(cached_size, output);
    for (int i = 0; i < array.size(); i++) {
      SerializeTo<type>(&array[i], output);
    }
  }